

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programs.hpp
# Opt level: O2

void __thiscall qe::ShaderAssignments::assign(ShaderAssignments *this,string *name,string *value)

{
  undefined1 local_50 [64];
  
  std::__cxx11::string::string((string *)local_50,(string *)name);
  std::__cxx11::string::string((string *)(local_50 + 0x20),(string *)value);
  std::vector<qe::ShaderAssignments::assigns_t,_std::allocator<qe::ShaderAssignments::assigns_t>_>::
  emplace_back<qe::ShaderAssignments::assigns_t>(&this->_assigns,(assigns_t *)local_50);
  assigns_t::~assigns_t((assigns_t *)local_50);
  return;
}

Assistant:

void assign(std::string name, std::string value) {
            _assigns.push_back(assigns_t {name, value});
        }